

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Session.h
# Opt level: O0

bool __thiscall
FIX::Session::isCorrectCompID(Session *this,SenderCompID *senderCompID,TargetCompID *targetCompID)

{
  __type_conflict1 _Var1;
  StringField *pSVar2;
  string *psVar3;
  string *psVar4;
  __type_conflict1 local_31;
  TargetCompID *targetCompID_local;
  SenderCompID *senderCompID_local;
  Session *this_local;
  
  if ((this->m_checkCompId & 1U) == 0) {
    this_local._7_1_ = true;
  }
  else {
    pSVar2 = &SessionID::getSenderCompID(&this->m_sessionID)->super_StringField;
    psVar3 = StringField::getValue_abi_cxx11_(pSVar2);
    psVar4 = StringField::getValue_abi_cxx11_(&targetCompID->super_StringField);
    _Var1 = std::operator==(psVar3,psVar4);
    local_31 = false;
    if (_Var1) {
      pSVar2 = &SessionID::getTargetCompID(&this->m_sessionID)->super_StringField;
      psVar3 = StringField::getValue_abi_cxx11_(pSVar2);
      psVar4 = StringField::getValue_abi_cxx11_(&senderCompID->super_StringField);
      local_31 = std::operator==(psVar3,psVar4);
    }
    this_local._7_1_ = local_31;
  }
  return this_local._7_1_;
}

Assistant:

bool isCorrectCompID(const SenderCompID &senderCompID, const TargetCompID &targetCompID) {
    if (!m_checkCompId) {
      return true;
    }

    return m_sessionID.getSenderCompID().getValue() == targetCompID.getValue()
           && m_sessionID.getTargetCompID().getValue() == senderCompID.getValue();
  }